

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::DitheringCase::DitheringCase
          (DitheringCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,bool ditheringEnabled,PatternType patternType,Vec4 *color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DitheringCase_0212e770;
  this->m_renderCtx = renderCtx;
  this->m_ditheringEnabled = ditheringEnabled;
  this->m_patternType = patternType;
  lVar4 = 0;
  do {
    (this->m_color).m_data[lVar4] = color->m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  iVar3 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8);
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 0x10);
  (this->m_renderFormat).redBits = (int)uVar1;
  (this->m_renderFormat).greenBits = (int)((ulong)uVar1 >> 0x20);
  (this->m_renderFormat).blueBits = (int)uVar2;
  (this->m_renderFormat).alphaBits = (int)((ulong)uVar2 >> 0x20);
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_iteration = 0;
  return;
}

Assistant:

DitheringCase::DitheringCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* const name, const char* const description, const bool ditheringEnabled, const PatternType patternType, const Vec4& color)
	: TestCase				(testCtx, name, description)
	, m_renderCtx			(renderCtx)
	, m_ditheringEnabled	(ditheringEnabled)
	, m_patternType			(patternType)
	, m_color				(color)
	, m_renderFormat		(renderCtx.getRenderTarget().getPixelFormat())
	, m_renderer			(DE_NULL)
	, m_iteration			(0)
{
}